

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExeFactory.cpp
# Opt level: O0

QString * ExeFactory::getTypeName(QString *__return_storage_ptr__,exe_type type)

{
  bool bVar1;
  mapped_type *ppEVar2;
  ExeBuilder *builder;
  _Self local_20;
  exe_type local_14;
  QString *pQStack_10;
  exe_type type_local;
  
  local_14 = type;
  pQStack_10 = __return_storage_ptr__;
  init((EVP_PKEY_CTX *)__return_storage_ptr__);
  local_20._M_node =
       (_Base_ptr)
       std::
       map<ExeFactory::exe_type,_ExeBuilder_*,_std::less<ExeFactory::exe_type>,_std::allocator<std::pair<const_ExeFactory::exe_type,_ExeBuilder_*>_>_>
       ::find(&builders,&local_14);
  builder = (ExeBuilder *)
            std::
            map<ExeFactory::exe_type,_ExeBuilder_*,_std::less<ExeFactory::exe_type>,_std::allocator<std::pair<const_ExeFactory::exe_type,_ExeBuilder_*>_>_>
            ::end(&builders);
  bVar1 = std::operator==(&local_20,(_Self *)&builder);
  if (bVar1) {
    QString::QString(__return_storage_ptr__,"Not supported");
  }
  else {
    ppEVar2 = std::
              map<ExeFactory::exe_type,_ExeBuilder_*,_std::less<ExeFactory::exe_type>,_std::allocator<std::pair<const_ExeFactory::exe_type,_ExeBuilder_*>_>_>
              ::operator[](&builders,&local_14);
    if (*ppEVar2 == (mapped_type)0x0) {
      QString::QString(__return_storage_ptr__,"Not supported");
    }
    else {
      (*(*ppEVar2)->_vptr_ExeBuilder[4])(__return_storage_ptr__);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

QString ExeFactory::getTypeName(exe_type type)
{
    ExeFactory::init(); //ensue that the builders are initialized

    if (builders.find(type) == builders.end()) return "Not supported";

    ExeBuilder* builder = builders[type];
    if (builder == NULL) return "Not supported";

    return builder->typeName();
}